

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O1

int http_WriteHttpRequest(void *Handle,char *buf,size_t *size,int timeout)

{
  char *__dest;
  size_t __n;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *__s;
  ulong uVar4;
  size_t bufsize;
  int local_3c;
  size_t local_38;
  
  if ((buf == (char *)0x0 || Handle == (void *)0x0) || size == (size_t *)0x0) {
    uVar3 = 0xffffff9b;
    if (size == (size_t *)0x0) {
      return -0x65;
    }
    uVar4 = 0;
  }
  else {
    bVar1 = false;
    bufsize = *size;
    __s = buf;
    local_3c = timeout;
    if (*(int *)((long)Handle + 0x88) == -3) {
      if (bufsize == 0) {
        __s = (char *)0x0;
        bufsize = 0;
        bVar1 = false;
      }
      else {
        __s = (char *)malloc(bufsize + 0x14);
        if (__s == (char *)0x0) {
          bufsize = 0;
        }
        else {
          sprintf(__s,"%zx\r\n",bufsize);
          local_38 = strlen(__s);
          __dest = __s + local_38;
          __n = *size;
          memcpy(__dest,buf,__n);
          (__dest + __n)[0] = '\r';
          (__dest + __n)[1] = '\n';
          bufsize = __n + local_38 + 2;
        }
        bVar1 = __s != (char *)0x0;
        if (__s == (char *)0x0) {
          return -0x68;
        }
      }
    }
    uVar2 = sock_write((SOCKINFO *)Handle,__s,bufsize,&local_3c);
    if (bVar1) {
      free(__s);
    }
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    uVar3 = 0;
    if ((int)uVar2 < 0) {
      uVar3 = uVar2;
    }
  }
  *size = uVar4;
  return uVar3;
}

Assistant:

int http_WriteHttpRequest(void *Handle, char *buf, size_t *size, int timeout)
{
	http_connection_handle_t *handle = (http_connection_handle_t *)Handle;
	char *tempbuf = NULL;
	size_t tempbufSize = 0;
	int freeTempbuf = 0;
	int numWritten = 0;

	if (!handle || !size || !buf) {
		if (size)
			*size = 0;
		return UPNP_E_INVALID_PARAM;
	}
	if (handle->contentLength == UPNP_USING_CHUNKED) {
		if (*size) {
			size_t tempSize = 0;
			tempbuf = malloc(
				*size + CHUNK_HEADER_SIZE + CHUNK_TAIL_SIZE);
			if (!tempbuf)
				return UPNP_E_OUTOF_MEMORY;
			/* begin chunk */
			sprintf(tempbuf, "%zx\r\n", *size);
			tempSize = strlen(tempbuf);
			memcpy(tempbuf + tempSize, buf, *size);
			memcpy(tempbuf + tempSize + *size, "\r\n", 2);
			/* end of chunk */
			tempbufSize = tempSize + *size + 2;
			freeTempbuf = 1;
		}
	} else {
		tempbuf = buf;
		tempbufSize = *size;
	}
	numWritten =
		sock_write(&handle->sock_info, tempbuf, tempbufSize, &timeout);
	if (freeTempbuf)
		free(tempbuf);
	if (numWritten < 0) {
		*size = 0;
		return numWritten;
	} else {
		*size = (size_t)numWritten;
		return UPNP_E_SUCCESS;
	}
}